

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O0

void * Res_SatProveUnsat(Abc_Ntk_t *pAig,Vec_Ptr_t *vFanins)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar2;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar3;
  int iVar4;
  int fCompl1;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *p;
  void *pvVar6;
  sat_solver *s;
  Abc_Obj_t *pAVar7;
  int local_40;
  int status;
  int nNodes;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  sat_solver *pSat;
  void *pCnf;
  Vec_Ptr_t *vFanins_local;
  Abc_Ntk_t *pAig_local;
  
  pSat = (sat_solver *)0x0;
  pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(vFanins,0);
  if ((pAVar5->pNtk == pAig) && (iVar4 = Abc_ObjIsPo(pAVar5), iVar4 != 0)) {
    p = Abc_NtkDfsNodes(pAig,(Abc_Obj_t **)vFanins->pArray,vFanins->nSize);
    pAVar5 = Abc_AigConst1(pAig);
    (pAVar5->field_6).pTemp = (void *)0x0;
    local_40 = 1;
    for (status = 0; iVar4 = Abc_NtkPiNum(pAig), status < iVar4; status = status + 1) {
      pAVar5 = Abc_NtkPi(pAig,status);
      pAVar5->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)local_40;
      local_40 = local_40 + 1;
    }
    for (status = 0; iVar4 = Vec_PtrSize(p), status < iVar4; status = status + 1) {
      pvVar6 = Vec_PtrEntry(p,status);
      *(long *)((long)pvVar6 + 0x40) = (long)local_40;
      local_40 = local_40 + 1;
    }
    for (status = 0; iVar4 = Vec_PtrSize(vFanins), status < iVar4; status = status + 1) {
      pvVar6 = Vec_PtrEntry(vFanins,status);
      *(long *)((long)pvVar6 + 0x40) = (long)local_40;
      local_40 = local_40 + 1;
    }
    s = sat_solver_new();
    sat_solver_store_alloc(s);
    pAVar5 = Abc_AigConst1(pAig);
    Res_SatAddConst1(s,(pAVar5->field_6).iTemp,0);
    for (status = 0; iVar4 = Vec_PtrSize(p), status < iVar4; status = status + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p,status);
      aVar2 = pAVar5->field_6;
      pAVar7 = Abc_ObjFanin0(pAVar5);
      aVar3 = pAVar7->field_6;
      pAVar7 = Abc_ObjFanin1(pAVar5);
      aVar1 = pAVar7->field_6;
      iVar4 = Abc_ObjFaninC0(pAVar5);
      fCompl1 = Abc_ObjFaninC1(pAVar5);
      Res_SatAddAnd(s,aVar2.iTemp,aVar3.iTemp,aVar1.iTemp,iVar4,fCompl1);
    }
    Vec_PtrFree(p);
    for (status = 0; iVar4 = Vec_PtrSize(vFanins), status < iVar4; status = status + 1) {
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(vFanins,status);
      aVar2 = pAVar5->field_6;
      pAVar7 = Abc_ObjFanin0(pAVar5);
      aVar3 = pAVar7->field_6;
      iVar4 = Abc_ObjFaninC0(pAVar5);
      Res_SatAddEqual(s,aVar2.iTemp,aVar3.iTemp,iVar4);
    }
    pvVar6 = Vec_PtrEntry(vFanins,0);
    Res_SatAddConst1(s,(int)*(undefined8 *)((long)pvVar6 + 0x40),0);
    pvVar6 = Vec_PtrEntry(vFanins,1);
    Res_SatAddConst1(s,(int)*(undefined8 *)((long)pvVar6 + 0x40),0);
    sat_solver_store_mark_clauses_a(s);
    pvVar6 = Vec_PtrEntry(vFanins,1);
    Sat_SolverDoubleClauses(s,(int)*(undefined8 *)((long)pvVar6 + 0x40));
    for (status = 2; iVar4 = Vec_PtrSize(vFanins), status < iVar4; status = status + 1) {
      pvVar6 = Vec_PtrEntry(vFanins,status);
      Res_SatAddEqual(s,(int)*(undefined8 *)((long)pvVar6 + 0x40),
                      (int)*(undefined8 *)((long)pvVar6 + 0x40) + local_40,0);
    }
    sat_solver_store_mark_roots(s);
    iVar4 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0);
    if (iVar4 == -1) {
      pSat = (sat_solver *)sat_solver_store_release(s);
    }
    sat_solver_delete(s);
    return pSat;
  }
  __assert_fail("pObj->pNtk == pAig && Abc_ObjIsPo(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resSat.c"
                ,0x3e,"void *Res_SatProveUnsat(Abc_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

void * Res_SatProveUnsat( Abc_Ntk_t * pAig, Vec_Ptr_t * vFanins )
{
    void * pCnf = NULL;
    sat_solver * pSat;
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i, nNodes, status;

    // make sure fanins contain POs of the AIG
    pObj = (Abc_Obj_t *)Vec_PtrEntry( vFanins, 0 );
    assert( pObj->pNtk == pAig && Abc_ObjIsPo(pObj) );

    // collect reachable nodes
    vNodes = Abc_NtkDfsNodes( pAig, (Abc_Obj_t **)vFanins->pArray, vFanins->nSize );

    // assign unique numbers to each node
    nNodes = 0;
    Abc_AigConst1(pAig)->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Abc_NtkForEachPi( pAig, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i ) // useful POs
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)nNodes++;

    // start the solver
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat );

    // add clause for the constant node
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)Abc_AigConst1(pAig)->pCopy, 0 );
    // add clauses for AND gates
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        Res_SatAddAnd( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, (int)(ABC_PTRUINT_T)Abc_ObjFanin1(pObj)->pCopy, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    Vec_PtrFree( vNodes );
    // add clauses for POs
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 
            (int)(ABC_PTRUINT_T)Abc_ObjFanin0(pObj)->pCopy, Abc_ObjFaninC0(pObj) );
    // add trivial clauses
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 0);
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // care-set
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 1);
    Res_SatAddConst1( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, 0 ); // on-set

    // bookmark the clauses of A
    sat_solver_store_mark_clauses_a( pSat );

    // duplicate the clauses
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanins, 1);
    Sat_SolverDoubleClauses( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy );
    // add the equality constraints
    Vec_PtrForEachEntryStart( Abc_Obj_t *, vFanins, pObj, i, 2 )
        Res_SatAddEqual( pSat, (int)(ABC_PTRUINT_T)pObj->pCopy, ((int)(ABC_PTRUINT_T)pObj->pCopy) + nNodes, 0 );

    // bookmark the roots
    sat_solver_store_mark_roots( pSat );

    // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_False )
    {
        pCnf = sat_solver_store_release( pSat );
//        printf( "unsat\n" );
    }
    else if ( status == l_True )
    {
//        printf( "sat\n" );
    }
    else
    {
//        printf( "undef\n" );
    }
    sat_solver_delete( pSat );
    return pCnf;
}